

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O3

SPIRVShaderResourceAttribs * __thiscall
Diligent::SPIRVShaderResources::GetResAttribs
          (SPIRVShaderResources *this,Uint32 n,Uint32 NumResources,Uint32 Offset)

{
  undefined4 in_register_0000000c;
  char (*Args_1) [30];
  uint uVar1;
  uint *in_R9;
  string msg;
  Uint32 local_38;
  Uint32 local_34;
  string local_30;
  
  Args_1 = (char (*) [30])CONCAT44(in_register_0000000c,Offset);
  local_38 = n;
  local_34 = NumResources;
  if (NumResources <= n) {
    FormatString<char[17],unsigned_int,char[42],unsigned_int>
              (&local_30,(Diligent *)"Resource index (",(char (*) [17])&local_38,
               (uint *)") is out of range. Total resource count: ",(char (*) [42])&local_34,in_R9);
    Args_1 = (char (*) [30])0x15c;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0x15c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = local_38 + Offset;
  if (this->m_TotalResources <= uVar1) {
    FormatString<char[26],char[30]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset + n < m_TotalResources",Args_1);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0x15d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    uVar1 = Offset + local_38;
  }
  return (SPIRVShaderResourceAttribs *)
         ((ulong)uVar1 * 0x20 +
         (long)(this->m_MemoryBuffer)._M_t.
               super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
               _M_t.
               super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
               .super__Head_base<0UL,_void_*,_false>._M_head_impl);
}

Assistant:

SPIRVShaderResourceAttribs& GetResAttribs(Uint32 n, Uint32 NumResources, Uint32 Offset) noexcept
    {
        VERIFY(n < NumResources, "Resource index (", n, ") is out of range. Total resource count: ", NumResources);
        VERIFY_EXPR(Offset + n < m_TotalResources);
        return reinterpret_cast<SPIRVShaderResourceAttribs*>(m_MemoryBuffer.get())[Offset + n];
    }